

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

void * fits_recalloc(void *ptr,size_t old_num,size_t new_num,size_t size)

{
  void *newptr;
  size_t size_local;
  size_t new_num_local;
  size_t old_num_local;
  void *ptr_local;
  
  if ((ptr == (void *)0x0) || (old_num == 0)) {
    ptr_local = calloc(new_num,size);
  }
  else {
    ptr_local = ptr;
    if (new_num != old_num) {
      if (new_num == 0) {
        if (ptr != (void *)0x0) {
          free(ptr);
        }
        ptr_local = (void *)0x0;
      }
      else if (new_num < old_num) {
        ptr_local = realloc(ptr,new_num * size);
        if (ptr_local == (void *)0x0) {
          free(ptr);
        }
      }
      else {
        ptr_local = realloc(ptr,new_num * size);
        if (ptr_local == (void *)0x0) {
          free(ptr);
        }
        else {
          memset((void *)((long)ptr_local + old_num * size),0,(new_num - old_num) * size);
        }
      }
    }
  }
  return ptr_local;
}

Assistant:

void *fits_recalloc(void *ptr, size_t old_num, size_t new_num, size_t size)
{
  void *newptr;

  if (ptr == 0 || old_num == 0) { /* Starting from nothing */

    return calloc(new_num, size);

  } else if (new_num == old_num) { /* Same size, do nothing */
    
    return ptr;

  } else if (new_num == 0) { /* Freeing */

    if (ptr) free(ptr);
    return 0;

  } else if (new_num < old_num) { /* Shrinking */
    
    newptr = realloc(ptr, new_num*size);
    if (!newptr) free(ptr);
    return (newptr);
  }

  /* Growing */
  newptr = realloc(ptr, new_num*size);
  if (!newptr) {
    free(ptr);
    return newptr;
  }

  /* Zero the new portion of the array */
  memset( (char *) newptr + old_num*size/sizeof(char), 0,
	  (new_num - old_num)*size );
  return (newptr);
}